

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O2

bool Js::DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining
               (DynamicTypeHandler *oldTypeHandler,DynamicTypeHandler *newTypeHandler)

{
  ushort uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  PropertyIndex PVar5;
  undefined4 *puVar6;
  
  if (oldTypeHandler == (DynamicTypeHandler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x232,"(oldTypeHandler)","oldTypeHandler");
    if (!bVar4) goto LAB_00c39623;
    *puVar6 = 0;
  }
  if (newTypeHandler == (DynamicTypeHandler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x233,"(newTypeHandler)","newTypeHandler");
    if (!bVar4) {
LAB_00c39623:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  bVar4 = true;
  if (oldTypeHandler->inlineSlotCapacity != newTypeHandler->inlineSlotCapacity) {
    bVar4 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(oldTypeHandler);
    if (bVar4) {
      uVar1 = newTypeHandler->inlineSlotCapacity;
      uVar2 = oldTypeHandler->inlineSlotCapacity;
      PVar5 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      bVar4 = (uint)uVar2 - (uint)PVar5 == (uint)uVar1;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining(DynamicTypeHandler * oldTypeHandler, DynamicTypeHandler * newTypeHandler)
    {
        Assert(oldTypeHandler);
        Assert(newTypeHandler);

        return
            oldTypeHandler->GetInlineSlotCapacity() == newTypeHandler->GetInlineSlotCapacity() ||
            (
                oldTypeHandler->IsObjectHeaderInlinedTypeHandler() &&
                newTypeHandler->GetInlineSlotCapacity() ==
                    oldTypeHandler->GetInlineSlotCapacity() - DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()
            );
    }